

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                        .super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>_>.
                        super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>.
                        _M_head_impl.impl_._M_t + 0x18))();
  CartesianProductGenerator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int,unsigned_char_const*,int,int),BLOCK_SIZE,int>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::AdvanceIfEnd<2ul>
            ((IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }